

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int I400Mirror(uint8_t *src_y,int src_stride_y,uint8_t *dst_y,int dst_stride_y,int width,int height)

{
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int local_4;
  
  if ((((in_RDI == (uint8_t *)0x0) || (in_RDX == (uint8_t *)0x0)) || (in_R8D < 1)) || (in_R9D == 0))
  {
    local_4 = -1;
  }
  else {
    if (in_R9D < 0) {
      in_R9D = -in_R9D;
      in_RDI = in_RDI + (in_R9D + -1) * in_ESI;
      in_ESI = -in_ESI;
    }
    MirrorPlane(in_RDI,in_ESI,in_RDX,in_ECX,in_R8D,in_R9D);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int I400Mirror(const uint8_t* src_y,
               int src_stride_y,
               uint8_t* dst_y,
               int dst_stride_y,
               int width,
               int height) {
  if (!src_y || !dst_y || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }

  MirrorPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  return 0;
}